

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bc7decomp.cpp
# Opt level: O0

bool bc7decomp::unpack_bc7_mode0_2(uint32_t mode,void *pBlock_bits,color_rgba *pPixels)

{
  uint32_t uVar1;
  uint l;
  uint8_t *puVar2;
  byte *pbVar3;
  long in_RDX;
  int in_EDI;
  uint32_t i_2;
  uint32_t c_2;
  uint32_t i_1;
  uint32_t s;
  color_rgba block_colors [3] [8];
  uint32_t c_1;
  uint32_t e_1;
  uint32_t i;
  uint32_t weights [16];
  uint32_t p;
  uint32_t pbits [6];
  uint32_t e;
  uint32_t c;
  color_rgba endpoints [6];
  uint32_t part;
  uint8_t *pBuf;
  uint32_t bit_offset;
  uint32_t WEIGHT_VALS;
  uint32_t PBITS;
  uint32_t ENDPOINT_BITS;
  uint32_t WEIGHT_BITS;
  uint32_t COMPS;
  uint32_t ENDPOINTS;
  uint32_t in_stack_fffffffffffffe48;
  uint32_t in_stack_fffffffffffffe4c;
  undefined8 in_stack_fffffffffffffe60;
  anon_union_4_2_6eba8969_for_color_rgba_0 *paVar4;
  uint32_t *in_stack_fffffffffffffe68;
  anon_union_4_2_6eba8969_for_color_rgba_0 *this;
  undefined4 in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe74;
  uint8_t local_188;
  color_rgba *local_160;
  uint local_158;
  uint local_154;
  uint local_150;
  uint local_14c;
  anon_union_4_2_6eba8969_for_color_rgba_0 local_148 [24];
  anon_union_4_2_6eba8969_for_color_rgba_0 aStack_e8;
  uint local_e4;
  uint local_e0;
  uint local_dc;
  uint32_t auStack_d8 [19];
  uint local_8c;
  uint32_t auStack_88 [6];
  uint local_70;
  uint local_6c;
  color_rgba local_68 [6];
  color_rgba acStack_50 [3];
  uint32_t local_44;
  undefined4 local_34;
  uint local_30;
  uint local_2c;
  uint32_t local_28;
  undefined4 local_24;
  undefined4 local_20;
  undefined4 local_1c;
  long local_18;
  int local_8;
  bool local_1;
  
  local_1c = 6;
  local_20 = 3;
  local_24 = 2;
  if (in_EDI == 0) {
    local_24 = 3;
  }
  local_28 = 5;
  if (in_EDI == 0) {
    local_28 = 4;
  }
  local_2c = 0;
  if (in_EDI == 0) {
    local_2c = 6;
  }
  local_30 = 1 << (sbyte)local_24;
  local_34 = 0;
  local_18 = in_RDX;
  local_8 = in_EDI;
  uVar1 = read_bits32((uint8_t *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                      in_stack_fffffffffffffe68,(uint32_t)((ulong)in_stack_fffffffffffffe60 >> 0x20)
                     );
  if (uVar1 == 1 << ((byte)local_8 & 0x1f)) {
    local_44 = read_bits32((uint8_t *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                           in_stack_fffffffffffffe68,
                           (uint32_t)((ulong)in_stack_fffffffffffffe60 >> 0x20));
    local_160 = local_68;
    do {
      color_rgba::color_rgba(local_160);
      local_160 = local_160 + 1;
    } while (local_160 != acStack_50);
    for (local_6c = 0; local_6c < 3; local_6c = local_6c + 1) {
      for (local_70 = 0; local_70 < 6; local_70 = local_70 + 1) {
        uVar1 = read_bits32((uint8_t *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70)
                            ,in_stack_fffffffffffffe68,
                            (uint32_t)((ulong)in_stack_fffffffffffffe60 >> 0x20));
        puVar2 = color_rgba::operator[](local_68 + local_70,local_6c);
        *puVar2 = (uint8_t)uVar1;
      }
    }
    for (local_8c = 0; local_8c < local_2c; local_8c = local_8c + 1) {
      uVar1 = read_bits32((uint8_t *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                          in_stack_fffffffffffffe68,
                          (uint32_t)((ulong)in_stack_fffffffffffffe60 >> 0x20));
      auStack_88[local_8c] = uVar1;
    }
    for (local_dc = 0; local_dc < 0x10; local_dc = local_dc + 1) {
      uVar1 = read_bits32((uint8_t *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                          in_stack_fffffffffffffe68,
                          (uint32_t)((ulong)in_stack_fffffffffffffe60 >> 0x20));
      auStack_d8[local_dc] = uVar1;
    }
    for (local_e0 = 0; local_e0 < 6; local_e0 = local_e0 + 1) {
      for (local_e4 = 0; local_e4 < 4; local_e4 = local_e4 + 1) {
        if (local_e4 == 3) {
          local_188 = 0xff;
        }
        else if (local_2c == 0) {
          pbVar3 = color_rgba::operator[](local_68 + local_e0,local_e4);
          uVar1 = bc7_dequant((uint)*pbVar3,local_28);
          local_188 = (uint8_t)uVar1;
        }
        else {
          pbVar3 = color_rgba::operator[](local_68 + local_e0,local_e4);
          uVar1 = bc7_dequant((uint)*pbVar3,auStack_88[local_e0],local_28);
          local_188 = (uint8_t)uVar1;
        }
        puVar2 = color_rgba::operator[](local_68 + local_e0,local_e4);
        *puVar2 = local_188;
      }
    }
    this = local_148;
    paVar4 = &aStack_e8;
    do {
      color_rgba::color_rgba((color_rgba *)&this->field_1);
      this = this + 1;
    } while (this != paVar4);
    for (local_14c = 0; local_14c < 3; local_14c = local_14c + 1) {
      for (local_150 = 0; local_150 < local_30; local_150 = local_150 + 1) {
        for (local_154 = 0; local_154 < 3; local_154 = local_154 + 1) {
          pbVar3 = color_rgba::operator[](local_68 + (local_14c << 1),local_154);
          l = (uint)*pbVar3;
          color_rgba::operator[](local_68 + (local_14c * 2 + 1),local_154);
          uVar1 = bc7_interp(l,in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48,0);
          puVar2 = color_rgba::operator[]
                             ((color_rgba *)
                              &local_148[(ulong)local_14c * 8 + (ulong)local_150].field_1,local_154)
          ;
          *puVar2 = (uint8_t)uVar1;
        }
        puVar2 = color_rgba::operator[]
                           ((color_rgba *)
                            &local_148[(ulong)local_14c * 8 + (ulong)local_150].field_1,3);
        *puVar2 = 0xff;
      }
    }
    for (local_158 = 0; local_158 < 0x10; local_158 = local_158 + 1) {
      *(anon_union_4_2_6eba8969_for_color_rgba_0 *)(local_18 + (ulong)local_158 * 4) =
           local_148[(ulong)(byte)g_bc7_partition3[local_44 * 0x10 + local_158] * 8 +
                     (ulong)auStack_d8[local_158]];
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool unpack_bc7_mode0_2(uint32_t mode, const void* pBlock_bits, color_rgba* pPixels)
{
	//const uint32_t SUBSETS = 3;
	const uint32_t ENDPOINTS = 6;
	const uint32_t COMPS = 3;
	const uint32_t WEIGHT_BITS = (mode == 0) ? 3 : 2;
	const uint32_t ENDPOINT_BITS = (mode == 0) ? 4 : 5;
	const uint32_t PBITS = (mode == 0) ? 6 : 0;
	const uint32_t WEIGHT_VALS = 1 << WEIGHT_BITS;
		
	uint32_t bit_offset = 0;
	const uint8_t* pBuf = static_cast<const uint8_t*>(pBlock_bits);

	if (read_bits32(pBuf, bit_offset, mode + 1) != (1U << mode)) return false;

	const uint32_t part = read_bits32(pBuf, bit_offset, (mode == 0) ? 4 : 6);

	color_rgba endpoints[ENDPOINTS];
	for (uint32_t c = 0; c < COMPS; c++)
		for (uint32_t e = 0; e < ENDPOINTS; e++)
			endpoints[e][c] = (uint8_t)read_bits32(pBuf, bit_offset, ENDPOINT_BITS);

	uint32_t pbits[6];
	for (uint32_t p = 0; p < PBITS; p++)
		pbits[p] = read_bits32(pBuf, bit_offset, 1);

	uint32_t weights[16];
	for (uint32_t i = 0; i < 16; i++)
		weights[i] = read_bits32(pBuf, bit_offset, ((!i) || (i == g_bc7_table_anchor_index_third_subset_1[part]) || (i == g_bc7_table_anchor_index_third_subset_2[part])) ? (WEIGHT_BITS - 1) : WEIGHT_BITS);

	assert(bit_offset == 128);

	for (uint32_t e = 0; e < ENDPOINTS; e++)
		for (uint32_t c = 0; c < 4; c++)
			endpoints[e][c] = (uint8_t)((c == 3) ? 255 : (PBITS ? bc7_dequant(endpoints[e][c], pbits[e], ENDPOINT_BITS) : bc7_dequant(endpoints[e][c], ENDPOINT_BITS)));

	color_rgba block_colors[3][8];
	for (uint32_t s = 0; s < 3; s++)
		for (uint32_t i = 0; i < WEIGHT_VALS; i++)
		{
			for (uint32_t c = 0; c < 3; c++)
				block_colors[s][i][c] = (uint8_t)bc7_interp(endpoints[s * 2 + 0][c], endpoints[s * 2 + 1][c], i, WEIGHT_BITS);
			block_colors[s][i][3] = 255;
		}

	for (uint32_t i = 0; i < 16; i++)
		pPixels[i] = block_colors[g_bc7_partition3[part * 16 + i]][weights[i]];

	return true;
}